

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O0

QpAsmStatus
quass2highs(Instance *instance,Settings *settings,Statistics *stats,QpModelStatus *qp_model_status,
           QpSolution *qp_solution,HighsModelStatus *highs_model_status,HighsBasis *highs_basis,
           HighsSolution *highs_solution)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  undefined4 *in_RCX;
  int *in_RDI;
  Eventhandler<QpModelStatus_&> *in_R8;
  QpModelStatus *in_R9;
  undefined1 *in_stack_00000008;
  undefined1 *in_stack_00000010;
  HighsInt i_1;
  HighsInt i;
  bool debug_report;
  HighsInt iRow;
  HighsInt iCol;
  QpAsmStatus qp_asm_return_status;
  double in_stack_ffffffffffffff98;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_ffffffffffffffa0;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  QpAsmStatus local_3c;
  
  Eventhandler<QpModelStatus_&>::fire(in_R8,in_R9);
  switch(*in_RCX) {
  case 0:
    *in_R9 = kNotset;
    return kError;
  case 1:
    *in_R9 = kInfeasible;
    return kError;
  case 2:
    *in_R9 = kLargeNullspace;
    local_3c = kOk;
    break;
  case 3:
    *in_R9 = kInterrupt|kOptimal;
    local_3c = kOk;
    break;
  case 4:
    *in_R9 = kInterrupt;
    local_3c = kOk;
    break;
  case 5:
    *in_R9 = kInterrupt|kTimeLimit;
    local_3c = kWarning;
    break;
  case 6:
    *in_R9 = kInterrupt|kIterationLimit;
    local_3c = kWarning;
    break;
  case 7:
    *in_R9 = kInfeasible;
    return kError;
  case 8:
    *in_R9 = 0x11;
    local_3c = kWarning;
    break;
  case 9:
    *in_R9 = kInfeasible;
    return kError;
  default:
    *in_R9 = kNotset;
    return kError;
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
             (size_type)in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
             (size_type)in_stack_ffffffffffffff98);
  for (local_40 = 0; local_40 < in_RDI[1]; local_40 = local_40 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_R8[1].subscribers.
                         super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_40);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000010 + 8),
                        (long)local_40);
    *pvVar4 = vVar1;
    in_stack_ffffffffffffff98 = (double)*in_RDI;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R8 + 6),(long)local_40);
    in_stack_ffffffffffffffa0 =
         (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
         (in_stack_ffffffffffffff98 * *pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000010 + 0x20),
                        (long)local_40);
    *pvVar4 = (value_type)in_stack_ffffffffffffffa0;
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
             (size_type)in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
             (size_type)in_stack_ffffffffffffff98);
  for (local_44 = 0; local_44 < in_RDI[2]; local_44 = local_44 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_R8[3].subscribers.
                         super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_44);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000010 + 0x38),
                        (long)local_44);
    *pvVar4 = vVar1;
    iVar3 = *in_RDI;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_R8[8].subscribers.
                         super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_44);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000010 + 0x50),
                        (long)local_44);
    *pvVar4 = (double)iVar3 * dVar2;
  }
  *in_stack_00000010 = 1;
  in_stack_00000010[1] = 1;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  for (local_4c = 0; local_4c < in_RDI[1]; local_4c = local_4c + 1) {
    pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                       ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                        &in_R8[9].subscribers.
                         super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_4c);
    if (*pvVar5 == kActiveAtLower) {
      pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_stack_00000008 + 0x30),(long)local_4c);
      *pvVar6 = kLower;
    }
    else {
      pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                         ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                          &in_R8[9].subscribers.
                           super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)local_4c);
      if (*pvVar5 == kActiveAtUpper) {
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (in_stack_00000008 + 0x30),(long)local_4c);
        *pvVar6 = kUpper;
      }
      else {
        pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                           ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                            &in_R8[9].subscribers.
                             super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)local_4c);
        if (*pvVar5 == kInactiveInBasis) {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_stack_00000008 + 0x30),(long)local_4c);
          *pvVar6 = kNonbasic;
        }
        else {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_stack_00000008 + 0x30),(long)local_4c);
          *pvVar6 = kBasic;
        }
      }
    }
  }
  for (local_50 = 0; local_50 < in_RDI[2]; local_50 = local_50 + 1) {
    pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                       ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                        &in_R8[10].subscribers.
                         super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_50);
    if (*pvVar5 == kActiveAtLower) {
      pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_stack_00000008 + 0x48),(long)local_50);
      *pvVar6 = kLower;
    }
    else {
      pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                         ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                          &in_R8[10].subscribers.
                           super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)local_50);
      if (*pvVar5 == kActiveAtUpper) {
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (in_stack_00000008 + 0x48),(long)local_50);
        *pvVar6 = kUpper;
      }
      else {
        pvVar5 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[]
                           ((vector<BasisStatus,_std::allocator<BasisStatus>_> *)
                            &in_R8[10].subscribers.
                             super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)local_50);
        if (*pvVar5 == kInactiveInBasis) {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_stack_00000008 + 0x48),(long)local_50);
          *pvVar6 = kNonbasic;
        }
        else {
          pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_stack_00000008 + 0x48),(long)local_50);
          *pvVar6 = kBasic;
        }
      }
    }
  }
  *in_stack_00000008 = 1;
  in_stack_00000008[1] = 0;
  in_stack_00000008[2] = 1;
  return local_3c;
}

Assistant:

static QpAsmStatus quass2highs(Instance& instance, Settings& settings,
                               Statistics& stats,
                               QpModelStatus& qp_model_status,
                               QpSolution& qp_solution,
                               HighsModelStatus& highs_model_status,
                               HighsBasis& highs_basis,
                               HighsSolution& highs_solution) {
  settings.qp_model_status_log.fire(qp_model_status);
  QpAsmStatus qp_asm_return_status = QpAsmStatus::kError;
  switch (qp_model_status) {
    case QpModelStatus::kOptimal:
      highs_model_status = HighsModelStatus::kOptimal;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kUnbounded:
      highs_model_status = HighsModelStatus::kUnbounded;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kInfeasible:
      highs_model_status = HighsModelStatus::kInfeasible;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kIterationLimit:
      highs_model_status = HighsModelStatus::kIterationLimit;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kTimeLimit:
      highs_model_status = HighsModelStatus::kTimeLimit;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kInterrupt:
      highs_model_status = HighsModelStatus::kInterrupt;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kUndetermined:
      highs_model_status = HighsModelStatus::kSolveError;
      qp_asm_return_status = QpAsmStatus::kError;
      return QpAsmStatus::kError;
    case QpModelStatus::kLargeNullspace:
      highs_model_status = HighsModelStatus::kSolveError;
      return QpAsmStatus::kError;
    case QpModelStatus::kError:
      highs_model_status = HighsModelStatus::kSolveError;
      return QpAsmStatus::kError;
    case QpModelStatus::kNotset:
      highs_model_status = HighsModelStatus::kNotset;
      return QpAsmStatus::kError;
    default:
      highs_model_status = HighsModelStatus::kNotset;
      return QpAsmStatus::kError;
  }

  assert(qp_asm_return_status != QpAsmStatus::kError);
  // extract variable values
  highs_solution.col_value.resize(instance.num_var);
  highs_solution.col_dual.resize(instance.num_var);
  for (HighsInt iCol = 0; iCol < instance.num_var; iCol++) {
    highs_solution.col_value[iCol] = qp_solution.primal.value[iCol];
    highs_solution.col_dual[iCol] =
        instance.sense * qp_solution.dualvar.value[iCol];
  }
  // extract constraint activity
  highs_solution.row_value.resize(instance.num_con);
  highs_solution.row_dual.resize(instance.num_con);
  // Negate the vector and Hessian
  for (HighsInt iRow = 0; iRow < instance.num_con; iRow++) {
    highs_solution.row_value[iRow] = qp_solution.rowactivity.value[iRow];
    highs_solution.row_dual[iRow] =
        instance.sense * qp_solution.dualcon.value[iRow];
  }
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;

  // extract basis status
  highs_basis.col_status.resize(instance.num_var);
  highs_basis.row_status.resize(instance.num_con);

  const bool debug_report =
      false;  // instance.num_var + instance.num_con < 100;
  for (HighsInt i = 0; i < instance.num_var; i++) {
    if (debug_report)
      printf("Column %2d: status %s\n", int(i),
             qpBasisStatusToString(qp_solution.status_var[i]).c_str());
    if (qp_solution.status_var[i] == BasisStatus::kActiveAtLower) {
      highs_basis.col_status[i] = HighsBasisStatus::kLower;
    } else if (qp_solution.status_var[i] == BasisStatus::kActiveAtUpper) {
      highs_basis.col_status[i] = HighsBasisStatus::kUpper;
    } else if (qp_solution.status_var[i] == BasisStatus::kInactiveInBasis) {
      highs_basis.col_status[i] = HighsBasisStatus::kNonbasic;
    } else {
      assert(qp_solution.status_var[i] == BasisStatus::kInactive);
      highs_basis.col_status[i] = HighsBasisStatus::kBasic;
    }
  }

  for (HighsInt i = 0; i < instance.num_con; i++) {
    if (debug_report)
      printf("Row    %2d: status %s\n", int(i),
             qpBasisStatusToString(qp_solution.status_con[i]).c_str());
    if (qp_solution.status_con[i] == BasisStatus::kActiveAtLower) {
      highs_basis.row_status[i] = HighsBasisStatus::kLower;
    } else if (qp_solution.status_con[i] == BasisStatus::kActiveAtUpper) {
      highs_basis.row_status[i] = HighsBasisStatus::kUpper;
    } else if (qp_solution.status_con[i] == BasisStatus::kInactiveInBasis) {
      highs_basis.row_status[i] = HighsBasisStatus::kNonbasic;
    } else {
      assert(qp_solution.status_con[i] == BasisStatus::kInactive);
      highs_basis.row_status[i] = HighsBasisStatus::kBasic;
    }
  }
  highs_basis.valid = true;
  highs_basis.alien = false;
  highs_basis.useful = true;
  return qp_asm_return_status;
}